

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::anon_unknown_2::GenerateFieldDocComment
               (Printer *printer,FieldDescriptor *field,Options *options,int function_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined4 in_register_0000000c;
  undefined1 *options_00;
  char *pcVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view value;
  string_view input;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar3 = (char *)CONCAT44(in_register_0000000c,function_type);
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  FieldDescriptor::DebugString_abi_cxx11_(&local_50,field);
  value._M_str = pcVar3;
  value._M_len = (size_t)local_50._M_dataplus._M_p;
  php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)local_50._M_string_length,value);
  input._M_str = pcVar3;
  input._M_len = (size_t)local_70._M_dataplus._M_p;
  php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
            (&local_90,(_anonymous_namespace_ *)local_70._M_string_length,input);
  options_00 = "def";
  text_00._M_str = " * Generated from protobuf field <code>^def^</code>\n";
  text_00._M_len = 0x34;
  io::Printer::Print<char[4],std::__cxx11::string>(printer,text_00,(char (*) [4])0x582017,&local_90)
  ;
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (function_type == 2) {
    bVar2 = FieldDescriptor::has_presence(field);
    if (bVar2) {
      options_00 = FieldDescriptor::kTypeToCppTypeMap;
      pcVar3 = "";
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        pcVar3 = "|null";
      }
    }
    else {
      pcVar3 = "";
    }
    php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)field,(FieldDescriptor *)options,
               (Options *)options_00);
    text_03._M_str = " * @return ^php_type^^maybe_null^\n";
    text_03._M_len = 0x22;
    local_70._M_dataplus._M_p = pcVar3;
    io::Printer::Print<char[9],std::__cxx11::string,char[11],char_const*>
              (printer,text_03,(char (*) [9])"php_type",&local_90,(char (*) [11])"maybe_null",
               (char **)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else if (function_type == 1) {
    php::(anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)field,(FieldDescriptor *)options,
               (Options *)options_00);
    text_01._M_str = " * @param ^php_type^ $var\n";
    text_01._M_len = 0x1a;
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,text_01,(char (*) [9])"php_type",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    text_02._M_str = " * @return $this\n";
    text_02._M_len = 0x11;
    io::Printer::Print<>(printer,text_02);
  }
  if ((field->options_->field_0)._impl_.deprecated_ == true) {
    text_04._M_str = " * @deprecated\n";
    text_04._M_len = 0xf;
    io::Printer::Print<>(printer,text_04);
  }
  text_05._M_str = " */\n";
  text_05._M_len = 4;
  io::Printer::Print<>(printer,text_05);
  return;
}

Assistant:

void GenerateFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                             const Options& options, int function_type) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then end with the field declaration, e.g.:
  //   optional string foo = 5;
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, field);
  printer->Print(" * Generated from protobuf field <code>^def^</code>\n", "def",
                 EscapePhpdoc(FirstLineOf(field->DebugString())));
  if (function_type == kFieldSetter) {
    printer->Print(" * @param ^php_type^ $var\n", "php_type",
                   PhpSetterTypeName(field, options));
    printer->Print(" * @return $this\n");
  } else if (function_type == kFieldGetter) {
    bool can_return_null =
        field->has_presence() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE;
    printer->Print(" * @return ^php_type^^maybe_null^\n", "php_type",
                   PhpGetterTypeName(field, options), "maybe_null",
                   can_return_null ? "|null" : "");
  }
  if (field->options().deprecated()) {
    printer->Print(" * @deprecated\n");
  }
  printer->Print(" */\n");
}